

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::CurrentTime
          (string *__return_storage_ptr__,cmTimestamp *this,string *formatString,bool utcFlag)

{
  undefined8 timeT;
  byte bVar1;
  ulong uVar2;
  string local_208;
  undefined4 local_1e4;
  istringstream local_1e0 [8];
  istringstream iss;
  undefined1 local_50 [8];
  string source_date_epoch;
  time_t currentTimeT;
  bool utcFlag_local;
  string *formatString_local;
  cmTimestamp *this_local;
  
  source_date_epoch.field_2._8_8_ = time((time_t *)0x0);
  std::__cxx11::string::string((string *)local_50);
  cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",(string *)local_50);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::istringstream::istringstream(local_1e0,(string *)local_50,_S_in);
    std::istream::operator>>(local_1e0,(long *)(source_date_epoch.field_2._M_local_buf + 8));
    bVar1 = std::ios::fail();
    if (((bVar1 & 1) != 0) || (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
      cmSystemTools::Error
                ("Cannot parse SOURCE_DATE_EPOCH as integer",(char *)0x0,(char *)0x0,(char *)0x0);
      exit(0x1b);
    }
    std::__cxx11::istringstream::~istringstream(local_1e0);
  }
  timeT = source_date_epoch.field_2._8_8_;
  if (source_date_epoch.field_2._8_8_ == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)&local_208,(string *)formatString);
    CreateTimestampFromTimeT(__return_storage_ptr__,this,timeT,&local_208,utcFlag);
    std::__cxx11::string::~string((string *)&local_208);
  }
  local_1e4 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CurrentTime(const std::string& formatString,
                                     bool utcFlag)
{
  time_t currentTimeT = time(nullptr);
  std::string source_date_epoch;
  cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
  if (!source_date_epoch.empty()) {
    std::istringstream iss(source_date_epoch);
    iss >> currentTimeT;
    if (iss.fail() || !iss.eof()) {
      cmSystemTools::Error("Cannot parse SOURCE_DATE_EPOCH as integer");
      exit(27);
    }
  }
  if (currentTimeT == time_t(-1)) {
    return std::string();
  }

  return CreateTimestampFromTimeT(currentTimeT, formatString, utcFlag);
}